

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  BYTE *pBVar3;
  undefined8 uVar4;
  ZSTD_matchState_t *ms_00;
  int *piVar5;
  U32 lowestValid;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int *ip;
  int *piVar15;
  seqDef *psVar16;
  int *iend;
  U32 UVar17;
  ulong uVar18;
  size_t offbaseFound;
  uint local_88;
  uint local_84;
  ZSTD_matchState_t *local_80;
  int *local_78;
  uint local_6c;
  int *local_68;
  int *local_60;
  long local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar3 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  local_40 = pBVar3 + uVar6;
  uVar13 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar13 < 6) {
    uVar11 = uVar13;
  }
  local_6c = 4;
  if (4 < uVar11) {
    local_6c = uVar11;
  }
  local_44 = *rep;
  ip = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar14 = (int)ip - (int)pBVar3;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_48 = iVar14 - uVar13;
  if (iVar14 - uVar6 <= uVar13) {
    local_48 = uVar6;
  }
  if (ms->loadedDictEnd != 0) {
    local_48 = uVar6;
  }
  local_4c = rep[1];
  local_48 = iVar14 - local_48;
  uVar6 = local_4c;
  if (local_48 < local_4c) {
    uVar6 = 0;
  }
  uVar13 = local_44;
  if (local_48 < local_44) {
    uVar13 = 0;
  }
  ms->lazySkipping = 0;
  pInLimit = (int *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_68 = (int *)((long)src + (srcSize - 0x20));
  local_80 = ms;
  local_38 = rep;
  do {
    local_88 = uVar6;
    ms_00 = local_80;
    uVar18 = (ulong)uVar13;
    local_58 = -uVar18;
    local_84 = uVar13;
    while( true ) {
      UVar17 = (U32)uVar18;
      if (local_60 <= ip) {
        if (local_4c <= local_48) {
          local_4c = 0;
        }
        uVar6 = local_4c;
        if (UVar17 != 0) {
          uVar6 = local_44;
        }
        if (local_44 <= local_48) {
          uVar6 = local_4c;
          local_44 = 0;
        }
        if (UVar17 != 0) {
          local_44 = UVar17;
        }
        if (local_88 != 0) {
          uVar6 = local_88;
        }
        *local_38 = local_44;
        local_38[1] = uVar6;
        return (long)pInLimit - (long)src;
      }
      if (UVar17 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)((long)ip + local_58 + 1) == *(int *)((long)ip + 1)) {
          sVar7 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + local_58 + 5),
                             (BYTE *)pInLimit);
          uVar18 = sVar7 + 4;
        }
      }
      offbaseFound = 999999999;
      if (local_6c == 6) {
        uVar8 = ZSTD_HcFindBestMatch_noDict_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (local_6c == 5) {
        uVar8 = ZSTD_HcFindBestMatch_noDict_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar8 = ZSTD_HcFindBestMatch_noDict_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar9 = uVar18;
      if (uVar18 < uVar8) {
        uVar9 = uVar8;
      }
      if (3 < uVar9) break;
      uVar18 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar18 >> 8) + 1);
      ms_00->lazySkipping = (uint)(0x7ff < uVar18);
      uVar18 = (ulong)local_84;
    }
    uVar12 = offbaseFound;
    if (uVar8 <= uVar18) {
      uVar12 = 1;
    }
    piVar5 = (int *)((long)ip + 1);
    if (uVar18 < uVar8) {
      piVar5 = ip;
    }
LAB_0017d00c:
    do {
      uVar8 = uVar9;
      iend = piVar5;
      piVar15 = ip;
      uVar18 = uVar12;
      if (local_60 <= piVar15) break;
      ip = (int *)((long)piVar15 + 1);
      local_78 = iend;
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else if ((local_84 != 0) && (*ip == *(int *)((long)ip + local_58))) {
        sVar7 = ZSTD_count((BYTE *)((long)piVar15 + 5),(BYTE *)((long)piVar15 + local_58 + 5),
                           (BYTE *)pInLimit);
        if (sVar7 < 0xfffffffffffffffc) {
          uVar6 = 0x1f;
          if ((uint)uVar18 != 0) {
            for (; (uint)uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          if ((int)((uVar6 ^ 0x1f) + (int)uVar8 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
            uVar18 = 1;
            local_78 = ip;
            uVar8 = sVar7 + 4;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_6c == 6) {
        uVar9 = ZSTD_HcFindBestMatch_noDict_6(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (local_6c == 5) {
        uVar9 = ZSTD_HcFindBestMatch_noDict_5(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_noDict_4(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar6 = (uint)uVar18;
      if (3 < uVar9) {
        uVar13 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar14 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        uVar12 = offbaseFound;
        piVar5 = ip;
        if ((int)((uVar13 ^ 0x1f) + (int)uVar8 * 4 + -0x1b) < (int)uVar9 * 4 - iVar14)
        goto LAB_0017d00c;
      }
      iend = local_78;
      if (local_60 <= ip) break;
      ip = (int *)((long)piVar15 + 2);
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else if ((local_84 != 0) && (*ip == *(int *)((long)ip + local_58))) {
        sVar7 = ZSTD_count((BYTE *)((long)piVar15 + 6),(BYTE *)((long)piVar15 + local_58 + 6),
                           (BYTE *)pInLimit);
        iend = local_78;
        if (sVar7 < 0xfffffffffffffffc) {
          uVar13 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          if ((int)((uVar13 ^ 0x1f) + (int)uVar8 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
            uVar18 = 1;
            iend = ip;
            uVar8 = sVar7 + 4;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_6c == 6) {
        uVar9 = ZSTD_HcFindBestMatch_noDict_6(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (local_6c == 5) {
        uVar9 = ZSTD_HcFindBestMatch_noDict_5(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_noDict_4(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      if (uVar9 < 4) break;
      uVar6 = 0x1f;
      if ((uint)uVar18 != 0) {
        for (; (uint)uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      iVar14 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      uVar12 = offbaseFound;
      piVar5 = ip;
    } while ((int)((uVar6 ^ 0x1f) + (int)uVar8 * 4 + -0x18) < (int)uVar9 * 4 - iVar14);
    if (3 < uVar18) {
      for (; ((src < iend && (local_40 < (BYTE *)((long)iend + (3 - uVar18)))) &&
             (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)iend + (2 - uVar18))));
          iend = (int *)((long)iend + -1)) {
        uVar8 = uVar8 + 1;
      }
      local_88 = local_84;
      local_84 = (U32)uVar18 - 3;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0017d594:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0017d5b3:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)iend - (long)src;
    pBVar3 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar3 + uVar9) {
LAB_0017d5d2:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_0017d5f1:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_68 < iend) {
      ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)iend,(BYTE *)local_68);
LAB_0017d30a:
      seqStore->lit = seqStore->lit + uVar9;
      if (0xffff < uVar9) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar3 = *src;
      *(undefined8 *)(pBVar3 + 8) = uVar4;
      pBVar3 = seqStore->lit;
      if (0x10 < uVar9) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar3 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar3 + 0x18) = uVar4;
        if (0x20 < (long)uVar9) {
          lVar10 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x20);
            uVar4 = puVar2[1];
            pBVar1 = pBVar3 + lVar10 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar4;
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x30);
            uVar4 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar4;
            lVar10 = lVar10 + 0x20;
          } while (pBVar1 + 0x20 < pBVar3 + uVar9);
        }
        goto LAB_0017d30a;
      }
      seqStore->lit = pBVar3 + uVar9;
    }
    psVar16 = seqStore->sequences;
    psVar16->litLength = (U16)uVar9;
    psVar16->offBase = (U32)uVar18;
    if (uVar8 < 3) {
LAB_0017d610:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0017d62f:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar16->mlBase = (U16)(uVar8 - 3);
    psVar16 = psVar16 + 1;
    seqStore->sequences = psVar16;
    if (local_80->lazySkipping != 0) {
      local_80->lazySkipping = 0;
    }
    uVar11 = local_88;
    uVar13 = local_84;
    for (src = (void *)((long)iend + uVar8);
        ((uVar6 = uVar11, ip = (int *)src, uVar6 != 0 && (src <= local_60)) &&
        (*src == *(int *)((long)src - (ulong)uVar6))); src = (void *)((long)src + sVar7 + 4)) {
      sVar7 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)uVar6)),
                         (BYTE *)pInLimit);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar16 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0017d594;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0017d5b3;
      pBVar3 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar3) goto LAB_0017d5d2;
      if (pInLimit < src) goto LAB_0017d5f1;
      if (local_68 < src) {
        ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)src,(BYTE *)local_68);
      }
      else {
        uVar4 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar3 = *src;
        *(undefined8 *)(pBVar3 + 8) = uVar4;
      }
      psVar16 = seqStore->sequences;
      psVar16->litLength = 0;
      psVar16->offBase = 1;
      if (sVar7 + 4 < 3) goto LAB_0017d610;
      if (0xffff < sVar7 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0017d62f;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar16->mlBase = (U16)(sVar7 + 1);
      psVar16 = psVar16 + 1;
      seqStore->sequences = psVar16;
      uVar11 = uVar13;
      uVar13 = uVar6;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_noDict);
}